

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paragraph.c
# Opt level: O3

int gotobop(int f,int n)

{
  int iVar1;
  bool bVar2;
  line *plVar3;
  bool bVar4;
  line *plVar5;
  ushort **ppuVar6;
  long lVar7;
  line *plVar8;
  undefined4 in_register_00000034;
  mgwin *pmVar9;
  int iVar10;
  int local_4c;
  mgwin *pmStack_48;
  int i;
  ulong local_40;
  line *local_38;
  
  local_40 = CONCAT44(in_register_00000034,n);
  if (n < 0) {
    iVar10 = do_gotoeop(f,-n,&local_4c);
  }
  else {
    pmVar9 = curwp;
    if (n != 0) {
      local_38 = curbp->b_headp;
      plVar8 = curwp->w_dotp;
      pmStack_48 = curwp;
      do {
        if (plVar8->l_bp != local_38) {
          iVar10 = pmVar9->w_dotline;
          bVar2 = false;
          plVar3 = plVar8->l_bp;
          do {
            plVar5 = plVar3;
            pmVar9->w_doto = 0;
            iVar1 = plVar8->l_used;
            if (0 < (long)iVar1) {
              ppuVar6 = __ctype_b_loc();
              lVar7 = 0;
              do {
                pmVar9 = pmStack_48;
                if ((*(byte *)((long)*ppuVar6 + (ulong)(byte)plVar8->l_text[lVar7] * 2 + 1) & 0x20)
                    == 0) {
                  bVar4 = true;
                  goto LAB_001149ae;
                }
                lVar7 = lVar7 + 1;
              } while (iVar1 != lVar7);
            }
            bVar4 = false;
            if (bVar2) break;
LAB_001149ae:
            bVar2 = bVar4;
            iVar10 = iVar10 + -1;
            pmVar9->w_dotline = iVar10;
            pmVar9->w_dotp = plVar5;
            plVar3 = plVar5->l_bp;
            plVar8 = plVar5;
          } while (plVar5->l_bp != local_38);
        }
        iVar10 = (int)local_40;
        local_40 = (ulong)(iVar10 - 1);
      } while (1 < iVar10);
    }
    pmVar9->w_rflag = pmVar9->w_rflag | 2;
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

int
gotobop(int f, int n)
{
	int col, nospace;

	/* the other way... */
	if (n < 0)
		return (gotoeop(f, -n));

	while (n-- > 0) {
		nospace = 0;
		while (lback(curwp->w_dotp) != curbp->b_headp) {
			curwp->w_doto = 0;
			col = 0;

			while (col < llength(curwp->w_dotp) &&
			    (isspace(lgetc(curwp->w_dotp, col))))
				col++;

			if (col >= llength(curwp->w_dotp)) {
				if (nospace)
					break;
			} else
				nospace = 1;

			curwp->w_dotline--;
			curwp->w_dotp = lback(curwp->w_dotp);
		}
	}
	/* force screen update */
	curwp->w_rflag |= WFMOVE;
	return (TRUE);
}